

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O1

void for_all_record_sizes(char *filename_fmt,_func_void_int_char_ptr_char_ptr *tests)

{
  uint uVar1;
  long lVar2;
  char description [14];
  char filename [500];
  char local_236 [14];
  char local_228 [504];
  
  lVar2 = 0;
  do {
    uVar1 = *(uint *)((long)&DAT_001072a8 + lVar2);
    snprintf(local_228,500,filename_fmt,(ulong)uVar1);
    snprintf(local_236,0xe,"%i bit record",(ulong)uVar1);
    (*tests)(uVar1,local_228,local_236);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  return;
}

Assistant:

void for_all_record_sizes(const char *filename_fmt,
                          void (*tests)(int record_size,
                                        const char *filename,
                                        const char *description)) {
    int sizes[] = {24, 28, 32};
    for (int i = 0; i < 3; i++) {
        int size = sizes[i];

        char filename[500];
#if defined(__clang__)
// This warning seems ok to ignore here in the tests.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
        snprintf(filename, 500, filename_fmt, size);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif

        char description[14];
        snprintf(description, 14, "%i bit record", size);

        tests(size, filename, description);
    }
}